

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

void __thiscall
Js::JavascriptLibrary::SetBoxedObjectValue_TTD
          (JavascriptLibrary *this,RecyclableObject *obj,Var value)

{
  Type TVar1;
  JavascriptBooleanObject *this_00;
  JavascriptStringObject *this_01;
  JavascriptSymbolObject *this_02;
  JavascriptNumberObject *this_03;
  
  TVar1 = ((obj->type).ptr)->typeId;
  if (TVar1 == TypeIds_SymbolObject) {
    this_02 = VarTo<Js::JavascriptSymbolObject,Js::RecyclableObject>(obj);
    JavascriptSymbolObject::SetValue_TTD(this_02,value);
    return;
  }
  if (TVar1 == TypeIds_NumberObject) {
    this_03 = VarTo<Js::JavascriptNumberObject,Js::RecyclableObject>(obj);
    JavascriptNumberObject::SetValue_TTD(this_03,value);
    return;
  }
  if (TVar1 == TypeIds_StringObject) {
    this_01 = VarTo<Js::JavascriptStringObject,Js::RecyclableObject>(obj);
    JavascriptStringObject::SetValue_TTD(this_01,value);
    return;
  }
  if (TVar1 == TypeIds_BooleanObject) {
    this_00 = VarTo<Js::JavascriptBooleanObject,Js::RecyclableObject>(obj);
    JavascriptBooleanObject::SetValue_TTD(this_00,value);
    return;
  }
  TTDAbort_unrecoverable_error("Unsupported nullptr value boxed object.");
}

Assistant:

void JavascriptLibrary::SetBoxedObjectValue_TTD(Js::RecyclableObject* obj, Js::Var value)
    {
        switch(obj->GetTypeId())
        {
        case Js::TypeIds_BooleanObject:
            Js::VarTo<Js::JavascriptBooleanObject>(obj)->SetValue_TTD(value);
            break;
        case Js::TypeIds_NumberObject:
            Js::VarTo<Js::JavascriptNumberObject>(obj)->SetValue_TTD(value);
            break;
        case Js::TypeIds_StringObject:
            Js::VarTo<Js::JavascriptStringObject>(obj)->SetValue_TTD(value);
            break;
        case Js::TypeIds_SymbolObject:
            Js::VarTo<Js::JavascriptSymbolObject>(obj)->SetValue_TTD(value);
            break;
        default:
            TTDAssert(false, "Unsupported nullptr value boxed object.");
            break;
        }
    }